

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O0

int udp_listener_init(void *arg,nng_url *url,nni_listener *nlistener)

{
  nni_sock *sock_00;
  nni_sock *sock;
  int rv;
  udp_ep *ep;
  nni_listener *nlistener_local;
  nng_url *url_local;
  void *arg_local;
  
  sock_00 = nni_listener_sock(nlistener);
  *(nni_listener **)((long)arg + 0x3f0) = nlistener;
  arg_local._4_4_ = udp_ep_init((udp_ep *)arg,url,sock_00,(nni_dialer *)0x0,nlistener);
  if (arg_local._4_4_ == 0) {
    sock._4_4_ = udp_check_url(url,true);
    if ((sock._4_4_ == 0) &&
       (sock._4_4_ = nni_url_to_address((nng_sockaddr *)((long)arg + 0x858),url), sock._4_4_ == 0))
    {
      arg_local._4_4_ = 0;
    }
    else {
      arg_local._4_4_ = sock._4_4_;
    }
  }
  return arg_local._4_4_;
}

Assistant:

static int
udp_listener_init(void *arg, nng_url *url, nni_listener *nlistener)
{
	udp_ep   *ep = arg;
	int       rv;
	nni_sock *sock = nni_listener_sock(nlistener);

	ep->nlistener = nlistener;
	if ((rv = udp_ep_init(ep, url, sock, NULL, nlistener)) != 0) {
		return (rv);
	}
	// Check for invalid URL components.
	if (((rv = udp_check_url(url, true)) != 0) ||
	    ((rv = nni_url_to_address(&ep->self_sa, url)) != 0)) {
		return (rv);
	}

	return (0);
}